

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool EmitAsConstantArray(ParseNode *pnodeArr,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FuncInfo *funcInfo;
  ParseNodeArrLit *pPVar4;
  
  if ((pnodeArr == (ParseNode *)0x0) || (pnodeArr->nop != knopArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc3,"(pnodeArr && pnodeArr->nop == knopArray)",
                       "pnodeArr && pnodeArr->nop == knopArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  funcInfo = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  bVar2 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  pPVar4 = ParseNode::AsParseNodeArrLit(pnodeArr);
  if (bVar2) {
    bVar2 = (bool)((pPVar4->field_0x20 & 4) >> 2);
  }
  else if ((pPVar4->field_0x20 & 1) == 0) {
    bVar2 = false;
  }
  else {
    pPVar4 = ParseNode::AsParseNodeArrLit(pnodeArr);
    bVar2 = 1 < pPVar4->count;
  }
  return bVar2;
}

Assistant:

bool EmitAsConstantArray(ParseNode *pnodeArr, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnodeArr && pnodeArr->nop == knopArray);

    // TODO: We shouldn't have to handle an empty funcinfo stack here, but there seem to be issues
    // with the stack involved nested deferral. Remove this null check when those are resolved.
    if (CreateNativeArrays(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
    {
        return pnodeArr->AsParseNodeArrLit()->arrayOfNumbers;
    }

    return pnodeArr->AsParseNodeArrLit()->arrayOfTaggedInts && pnodeArr->AsParseNodeArrLit()->count > 1;
}